

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  long lVar1;
  size_t sVar2;
  Rep *pRVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int iVar6;
  FileDescriptor *pFVar7;
  FileDescriptorProto *proto;
  undefined1 is_descriptor_00;
  string *in_RCX;
  void **ppvVar8;
  int num;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined7 in_register_00000031;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void **ppvVar15;
  char *__end;
  FileDescriptorSet files;
  string files_data;
  FileDescriptorSet local_f0;
  string local_c0;
  RepeatedPtrFieldBase *local_a0;
  Printer *local_98;
  pointer local_90;
  size_t local_88;
  void **local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  io::Printer::Print<>
            (printer,
             "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,
             "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
            );
  if ((int)CONCAT71(in_register_00000031,is_descriptor) != 0) {
    if (0 < *(int *)(file + 0x2c)) {
      lVar11 = 0;
      lVar9 = 0;
      do {
        local_f0.super_Message.super_MessageLite._vptr_MessageLite =
             (MessageLite)&local_f0._has_bits_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
        GenerateMessageToPool
                  ((string *)&local_f0,(Descriptor *)(*(long *)(file + 0x68) + lVar11),printer);
        if (local_f0.super_Message.super_MessageLite._vptr_MessageLite !=
            (MessageLite)&local_f0._has_bits_) {
          operator_delete((void *)local_f0.super_Message.super_MessageLite._vptr_MessageLite);
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0x90;
      } while (lVar9 < *(int *)(file + 0x2c));
    }
    if (0 < *(int *)(file + 0x30)) {
      lVar9 = 0;
      lVar11 = 0;
      do {
        GenerateEnumToPool((EnumDescriptor *)(*(long *)(file + 0x70) + lVar9),printer);
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x50;
      } while (lVar11 < *(int *)(file + 0x30));
    }
    io::Printer::Print<>(printer,"$pool->finish();\n");
    goto LAB_0026a342;
  }
  if (0 < *(int *)(file + 0x20)) {
    iVar10 = 0;
    do {
      pFVar7 = FileDescriptor::dependency(file,iVar10);
      is_descriptor_00 = SUB81(in_RCX,0);
      sVar2 = (*(undefined8 **)pFVar7)[1];
      if (sVar2 == kDescriptorFile_abi_cxx11_._M_string_length) {
        if (sVar2 != 0) {
          iVar6 = bcmp((void *)**(undefined8 **)pFVar7,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                       sVar2);
          is_descriptor_00 = SUB81(in_RCX,0);
          if (iVar6 != 0) goto LAB_00269f4f;
        }
      }
      else {
LAB_00269f4f:
        pFVar7 = FileDescriptor::dependency(file,iVar10);
        GeneratedMetadataFileName_abi_cxx11_
                  ((string *)&local_f0,(php *)pFVar7,(FileDescriptor *)0x0,(bool)is_descriptor_00);
        FilenameToClassname(&local_c0,(string *)&local_f0);
        in_RCX = &local_c0;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"\\^name^::initOnce();\n",(char (*) [5])0x3958cc,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_f0.super_Message.super_MessageLite._vptr_MessageLite !=
            (MessageLite)&local_f0._has_bits_) {
          operator_delete((void *)local_f0.super_Message.super_MessageLite._vptr_MessageLite);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < *(int *)(file + 0x20));
  }
  local_98 = printer;
  FileDescriptorSet::FileDescriptorSet(&local_f0);
  if (local_f0.file_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_00269ff4:
    internal::RepeatedPtrFieldBase::Reserve
              (&local_f0.file_.super_RepeatedPtrFieldBase,
               local_f0.file_.super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0026a003:
    (local_f0.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size =
         (local_f0.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size + 1;
    proto = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                      (local_f0.file_.super_RepeatedPtrFieldBase.arena_);
    (local_f0.file_.super_RepeatedPtrFieldBase.rep_)->elements
    [local_f0.file_.super_RepeatedPtrFieldBase.current_size_] = proto;
  }
  else {
    if ((local_f0.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
        local_f0.file_.super_RepeatedPtrFieldBase.current_size_) {
      if ((local_f0.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size ==
          local_f0.file_.super_RepeatedPtrFieldBase.total_size_) goto LAB_00269ff4;
      goto LAB_0026a003;
    }
    proto = (FileDescriptorProto *)
            (local_f0.file_.super_RepeatedPtrFieldBase.rep_)->elements
            [local_f0.file_.super_RepeatedPtrFieldBase.current_size_];
  }
  local_f0.file_.super_RepeatedPtrFieldBase.current_size_ =
       local_f0.file_.super_RepeatedPtrFieldBase.current_size_ + 1;
  FileDescriptor::CopyTo(file,proto);
  pRVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
  local_80 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    local_80 = (void **)0x0;
  }
  lVar9 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar9 != 0) {
    local_a0 = &(proto->dependency_).super_RepeatedPtrFieldBase;
    local_88 = kDescriptorFile_abi_cxx11_._M_string_length;
    local_90 = kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
    uVar13 = 8;
    lVar11 = -8;
    lVar14 = 0;
    lVar12 = 0;
    do {
      sVar2 = *(size_t *)((long)local_80[lVar12] + 8);
      if ((sVar2 != local_88) ||
         ((sVar2 != 0 && (iVar10 = bcmp(*local_80[lVar12],local_90,sVar2), iVar10 != 0)))) {
        iVar6 = (int)lVar12;
        iVar10 = (int)(uVar13 >> 3);
        num = iVar10 - iVar6;
        if (0 < num) {
          uVar13 = (ulong)(uint)(iVar10 - iVar6);
          lVar9 = lVar14 >> 0x20;
          do {
            puVar4 = (undefined8 *)
                     ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar9];
            if ((puVar4 != (undefined8 *)0x0) &&
               ((proto->dependency_).super_RepeatedPtrFieldBase.arena_ == (Arena *)0x0)) {
              if ((undefined8 *)*puVar4 != puVar4 + 2) {
                operator_delete((undefined8 *)*puVar4);
              }
              operator_delete(puVar4);
            }
            uVar13 = uVar13 - 1;
            lVar9 = lVar9 + 1;
          } while (uVar13 != 0);
          internal::RepeatedPtrFieldBase::CloseGap(local_a0,iVar6,num);
        }
        break;
      }
      uVar13 = uVar13 + 8;
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0x100000000;
      lVar1 = lVar9 * 8 + lVar11;
      lVar11 = lVar11 + -8;
    } while (lVar1 != 0);
  }
  lVar9 = (long)(proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar9) {
    pRVar3 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
    lVar11 = 0;
    do {
      FieldDescriptorProto::Clear((FieldDescriptorProto *)pRVar3->elements[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
    (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  pRVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar15 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar15 = (void **)0x0;
  }
  if (((long)(proto->message_type_).super_RepeatedPtrFieldBase.current_size_ & 0x1fffffffffffffffU)
      != 0) {
    do {
      pvVar5 = *ppvVar15;
      iVar10 = *(int *)((long)pvVar5 + 0x80);
      if (0 < (long)iVar10) {
        lVar9 = *(long *)((long)pvVar5 + 0x88);
        lVar11 = 0;
        do {
          FieldDescriptorProto::Clear(*(FieldDescriptorProto **)(lVar9 + 8 + lVar11 * 8));
          lVar11 = lVar11 + 1;
        } while (iVar10 != lVar11);
        *(undefined4 *)((long)pvVar5 + 0x80) = 0;
      }
      ppvVar15 = ppvVar15 + 1;
      pRVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
      ppvVar8 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar8 = (void **)0x0;
      }
    } while (ppvVar15 != ppvVar8 + (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_f0,&local_c0);
  printer = local_98;
  io::Printer::Print<>(local_98,"$pool->internalAddGeneratedFile(hex2bin(\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (local_c0._M_string_length != 0) {
    uVar13 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_c0);
      BinaryToHex(&local_50,&local_70);
      uVar13 = uVar13 + 0x1e;
      local_78 = "";
      if (uVar13 < local_c0._M_string_length) {
        local_78 = " .";
      }
      io::Printer::Print<char[5],std::__cxx11::string,char[4],char_const*>
                (printer,"\"^data^\"^dot^\n",(char (*) [5])0x3a6885,&local_50,(char (*) [4])"dot",
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    } while (uVar13 < local_c0._M_string_length);
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"), true);\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  FileDescriptorSet::~FileDescriptorSet(&local_f0);
LAB_0026a342:
  io::Printer::Print<>(printer,"static::$is_initialized = true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(file->dependency(i), is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "), true);\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}